

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominance.cpp
# Opt level: O2

void __thiscall
mocker::DominatorTree::buildImmediateDominator(DominatorTree *this,FunctionModule *func)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  _List_node_base *p_Var6;
  __node_base *p_Var7;
  __node_base *p_Var8;
  _Hash_node_base u;
  __node_base *p_Var9;
  size_t node;
  _List_node_base *local_60;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  p_Var6 = (_List_node_base *)&func->bbs;
  local_50 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->immediateDominator;
  local_58 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->dominators;
  local_60 = p_Var6;
  do {
    while( true ) {
      p_Var6 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var6 == local_60) {
        return;
      }
      node = (size_t)p_Var6[1]._M_next;
      if (this->reverse == false) break;
      ir::BasicBlock::getSuccessors
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                 (BasicBlock *)(p_Var6 + 1));
      puVar2 = local_48._M_impl.super__Vector_impl_data._M_finish;
      puVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
      u._M_nxt = (_Hash_node_base *)0xffffffffffffffff;
      if (puVar1 != puVar2) goto LAB_0014c263;
LAB_0014c251:
      pmVar4 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_50,&node);
      *pmVar4 = (mapped_type)u._M_nxt;
    }
    u._M_nxt = (_Hash_node_base *)0xffffffffffffffff;
    if ((_List_node_base *)node == local_60->_M_next[1]._M_next) goto LAB_0014c251;
LAB_0014c263:
    pmVar5 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(local_58,&node);
    p_Var7 = &(pmVar5->_M_h)._M_before_begin;
    p_Var8 = p_Var7;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      u._M_nxt = p_Var8[1]._M_nxt;
      p_Var9 = p_Var7;
      if (u._M_nxt != (_Hash_node_base *)node) {
        do {
          p_Var9 = p_Var9->_M_nxt;
          if (p_Var9 == (__node_base *)0x0) goto LAB_0014c251;
        } while ((p_Var9[1]._M_nxt == (_Hash_node_base *)node) ||
                (bVar3 = isStrictlyDominating(this,(size_t)u._M_nxt,(size_t)p_Var9[1]._M_nxt),
                !bVar3));
      }
    }
  } while( true );
}

Assistant:

void DominatorTree::buildImmediateDominator(const ir::FunctionModule &func) {
  // For a faster algorithm, see [Lengauer, Tarjan, 1979]

  for (const auto &bb : func.getBBs()) {
    auto node = bb.getLabelID();
    if (!reverse && node == func.getFirstBBLabel()) {
      immediateDominator[node] = std::size_t(-1);
      continue;
    }
    if (reverse && bb.getSuccessors().empty()) {
      immediateDominator[node] = std::size_t(-1);
      continue;
    }

    const auto &Dominators = dominators.at(node);
    for (auto dominator : Dominators) {
      if (dominator == node) // is not strict
        continue;
      bool flag = true;
      for (auto otherDominator : Dominators) {
        if (otherDominator == node)
          continue;
        if (isStrictlyDominating(dominator, otherDominator)) {
          flag = false;
          break;
        }
      }
      if (flag) {
        immediateDominator[node] = dominator;
        break;
      }
    }
  }
}